

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_fixed_wnaf_small_helper(int *wnaf,int *wnaf_expected,int w)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  secp256k1_scratch *scratch;
  long lVar4;
  code *pcVar5;
  secp256k1_strauss_point_state *psVar6;
  long extraout_RDX;
  secp256k1_strauss_point_state *scratch_00;
  size_t sVar7;
  secp256k1_gej *r;
  ulong uVar8;
  uchar *out32;
  secp256k1_gej *psVar9;
  secp256k1_strauss_point_state *scratch_01;
  secp256k1_gej *psVar10;
  secp256k1_sha256 *hash;
  secp256k1_strauss_point_state *elem;
  code *cb;
  secp256k1_strauss_point_state *cbdata;
  uint64_t *unaff_R12;
  secp256k1_sha256 *acc;
  secp256k1_callback *error_callback;
  secp256k1_ge *unaff_R13;
  ulong uVar11;
  secp256k1_scalar *psVar12;
  secp256k1_gej *psVar13;
  secp256k1_strauss_point_state *r_00;
  bool bVar14;
  ulong uStack_2098;
  secp256k1_strauss_state sStack_2090;
  secp256k1_fe asStack_2078 [8];
  secp256k1_strauss_point_state sStack_1f38;
  secp256k1_ge asStack_1b28 [8];
  secp256k1_callback *psStack_1858;
  secp256k1_gej *psStack_1850;
  secp256k1_strauss_point_state *psStack_1848;
  secp256k1_strauss_point_state *psStack_1840;
  secp256k1_strauss_point_state *psStack_1838;
  size_t sStack_1828;
  undefined1 auStack_1810 [8];
  undefined1 auStack_1808 [88];
  secp256k1_gej sStack_17b0;
  secp256k1_gej sStack_1730;
  secp256k1_gej sStack_16b0;
  secp256k1_gej sStack_1630;
  secp256k1_gej asStack_15b0 [2];
  secp256k1_strauss_point_state sStack_1470;
  secp256k1_gej sStack_1060;
  secp256k1_gej sStack_fe0;
  undefined1 auStack_f60 [720];
  secp256k1_sha256 *psStack_c90;
  undefined1 *puStack_c88;
  secp256k1_gej *psStack_c80;
  secp256k1_gej *psStack_c78;
  code *apcStack_c70 [2];
  int iStack_c5e;
  undefined2 uStack_c5a;
  secp256k1_gej *psStack_c58;
  long lStack_c50;
  undefined1 auStack_c48 [40];
  int aiStack_c20 [6];
  secp256k1_sha256 sStack_c08;
  secp256k1_sha256 sStack_b98;
  secp256k1_gej *psStack_b30;
  uint64_t *puStack_b28;
  secp256k1_ge *psStack_b20;
  secp256k1_context *psStack_b18;
  secp256k1_gej *psStack_b10;
  secp256k1_strauss_point_state *psStack_b08;
  undefined1 auStack_b00 [64];
  secp256k1_gej sStack_ac0;
  secp256k1_strauss_state sStack_a40;
  secp256k1_gej sStack_a28;
  secp256k1_gej sStack_9a8;
  secp256k1_gej sStack_928;
  secp256k1_context sStack_8a8;
  secp256k1_ge asStack_710 [8];
  secp256k1_strauss_point_state sStack_450;
  
  uVar3 = 0x20;
  do {
    uVar1 = (int)uVar3 - 1;
    uVar3 = (ulong)uVar1;
    if (wnaf[uVar3] != 0) {
      test_fixed_wnaf_small_helper_cold_1();
      goto LAB_00169002;
    }
  } while (8 < uVar1);
  uVar1 = 7;
  while (wnaf[uVar1] == wnaf_expected[uVar1]) {
    bVar14 = uVar1 == 0;
    uVar1 = uVar1 - 1;
    if (bVar14) {
      return;
    }
  }
LAB_00169002:
  test_fixed_wnaf_small_helper_cold_2();
  psVar13 = (secp256k1_gej *)auStack_b00;
  psVar6 = (secp256k1_strauss_point_state *)((ulong)wnaf_expected & 0xffffffff);
  psStack_b08 = (secp256k1_strauss_point_state *)0x16902a;
  testutil_random_scalar_order_test((secp256k1_scalar *)(auStack_b00 + 0x20));
  psStack_b08 = (secp256k1_strauss_point_state *)0x16903b;
  secp256k1_scalar_add
            ((secp256k1_scalar *)auStack_b00,(secp256k1_scalar *)(auStack_b00 + 0x20),
             (secp256k1_scalar *)wnaf);
  psStack_b08 = (secp256k1_strauss_point_state *)0x169046;
  secp256k1_scalar_negate((secp256k1_scalar *)auStack_b00,(secp256k1_scalar *)auStack_b00);
  psVar12 = (secp256k1_scalar *)CTX;
  if ((int)wnaf_expected == 0) {
    psStack_b08 = (secp256k1_strauss_point_state *)0x16919e;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_928,(secp256k1_scalar *)(auStack_b00 + 0x20));
    psStack_b08 = (secp256k1_strauss_point_state *)0x1691b1;
    secp256k1_ecmult_gen
              ((secp256k1_ecmult_gen_context *)psVar12,&sStack_9a8,(secp256k1_scalar *)auStack_b00);
    psStack_b08 = (secp256k1_strauss_point_state *)0x1691c4;
    secp256k1_ecmult_gen
              ((secp256k1_ecmult_gen_context *)psVar12,&sStack_a28,(secp256k1_scalar *)wnaf);
  }
  else {
    psStack_b08 = (secp256k1_strauss_point_state *)0x16905e;
    testutil_random_ge_test((secp256k1_ge *)&sStack_8a8);
    sStack_ac0.infinity = (int)sStack_8a8.ecmult_gen_ctx.ge_offset.y.n[0];
    sStack_ac0.x.n[0] = sStack_8a8.ecmult_gen_ctx._0_8_;
    sStack_ac0.x.n[1] = sStack_8a8.ecmult_gen_ctx.scalar_offset.d[0];
    sStack_ac0.x.n[2] = sStack_8a8.ecmult_gen_ctx.scalar_offset.d[1];
    sStack_ac0.x.n[3] = sStack_8a8.ecmult_gen_ctx.scalar_offset.d[2];
    sStack_ac0.x.n[4] = sStack_8a8.ecmult_gen_ctx.scalar_offset.d[3];
    sStack_ac0.y.n[0] = sStack_8a8.ecmult_gen_ctx.ge_offset.x.n[0];
    sStack_ac0.y.n[1] = sStack_8a8.ecmult_gen_ctx.ge_offset.x.n[1];
    sStack_ac0.y.n[2] = sStack_8a8.ecmult_gen_ctx.ge_offset.x.n[2];
    sStack_ac0.y.n[3] = sStack_8a8.ecmult_gen_ctx.ge_offset.x.n[3];
    sStack_ac0.y.n[4] = sStack_8a8.ecmult_gen_ctx.ge_offset.x.n[4];
    sStack_ac0.z.n[0] = 1;
    sStack_ac0.z.n[1] = 0;
    sStack_ac0.z.n[2] = 0;
    sStack_ac0.z.n[3] = 0;
    sStack_ac0.z.n[4] = 0;
    if ((int)wnaf_expected == 1) {
      unaff_R12 = sStack_8a8.ecmult_gen_ctx.ge_offset.y.n + 1;
      unaff_R13 = asStack_710;
      psVar6 = &sStack_450;
      psVar12 = &secp256k1_scalar_zero;
      psStack_b08 = (secp256k1_strauss_point_state *)0x169121;
      sStack_9a8.x.n[0] = (uint64_t)unaff_R12;
      sStack_9a8.x.n[1] = (uint64_t)unaff_R13;
      sStack_9a8.x.n[2] = (uint64_t)psVar6;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_9a8,&sStack_928,1,&sStack_ac0,
                 (secp256k1_scalar *)(auStack_b00 + 0x20),&secp256k1_scalar_zero);
      psStack_b08 = (secp256k1_strauss_point_state *)0x16914f;
      sStack_a28.x.n[0] = (uint64_t)unaff_R12;
      sStack_a28.x.n[1] = (uint64_t)unaff_R13;
      sStack_a28.x.n[2] = (uint64_t)psVar6;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_a28,&sStack_9a8,1,&sStack_ac0,
                 (secp256k1_scalar *)auStack_b00,&secp256k1_scalar_zero);
      psStack_b08 = (secp256k1_strauss_point_state *)0x16917d;
      sStack_a40.aux = (secp256k1_fe *)unaff_R12;
      sStack_a40.pre_a = unaff_R13;
      sStack_a40.ps = psVar6;
      secp256k1_ecmult_strauss_wnaf
                (&sStack_a40,&sStack_a28,1,&sStack_ac0,(secp256k1_scalar *)wnaf,
                 &secp256k1_scalar_zero);
      psVar13 = &sStack_ac0;
    }
    else {
      psVar12 = (secp256k1_scalar *)&sStack_8a8;
      psStack_b08 = (secp256k1_strauss_point_state *)0x1691e3;
      secp256k1_ecmult_const
                (&sStack_928,(secp256k1_ge *)psVar12,(secp256k1_scalar *)(auStack_b00 + 0x20));
      psStack_b08 = (secp256k1_strauss_point_state *)0x1691f6;
      secp256k1_ecmult_const(&sStack_9a8,(secp256k1_ge *)psVar12,(secp256k1_scalar *)auStack_b00);
      psStack_b08 = (secp256k1_strauss_point_state *)0x169209;
      secp256k1_ecmult_const(&sStack_a28,(secp256k1_ge *)psVar12,(secp256k1_scalar *)wnaf);
      psVar13 = (secp256k1_gej *)auStack_b00;
    }
  }
  psStack_b08 = (secp256k1_strauss_point_state *)0x169226;
  secp256k1_gej_add_var(&sStack_a28,&sStack_a28,&sStack_928,(secp256k1_fe *)0x0);
  psStack_b08 = (secp256k1_strauss_point_state *)0x16923b;
  psVar9 = &sStack_a28;
  psVar10 = &sStack_a28;
  secp256k1_gej_add_var(&sStack_a28,&sStack_a28,&sStack_9a8,(secp256k1_fe *)0x0);
  if (sStack_a28.infinity != 0) {
    return;
  }
  psStack_b08 = (secp256k1_strauss_point_state *)test_ecmult_constants_sha;
  test_ecmult_target_cold_1();
  out32 = (uchar *)((ulong)psVar10 & 0xffffffff);
  apcStack_c70[0] = (code *)0x16928b;
  psStack_c58 = psVar9;
  lStack_c50 = extraout_RDX;
  psStack_b30 = &sStack_a28;
  puStack_b28 = unaff_R12;
  psStack_b20 = unaff_R13;
  psStack_b18 = (secp256k1_context *)psVar12;
  psStack_b10 = psVar13;
  psStack_b08 = psVar6;
  scratch = secp256k1_scratch_create(&CTX->error_callback,0x10000);
  iStack_c5e = (int)psVar10;
  acc = &sStack_b98;
  sStack_b98.s[0] = 0x6a09e667;
  sStack_b98.s[1] = 0xbb67ae85;
  sStack_b98.s[2] = 0x3c6ef372;
  sStack_b98.s[3] = 0xa54ff53a;
  sStack_b98.s[4] = 0x510e527f;
  sStack_b98.s[5] = 0x9b05688c;
  sStack_b98.s[6] = 0x1f83d9ab;
  sStack_b98.s[7] = 0x5be0cd19;
  psVar9 = (secp256k1_gej *)0x0;
  sStack_b98.bytes = 0;
  psVar12 = (secp256k1_scalar *)(auStack_c48 + 0x20);
  auStack_c48._32_4_ = 0;
  auStack_c48._36_4_ = 0;
  aiStack_c20[0] = 0;
  aiStack_c20[1] = 0;
  aiStack_c20[2] = 0;
  aiStack_c20[3] = 0;
  aiStack_c20[4] = 0;
  aiStack_c20[5] = 0;
  apcStack_c70[0] = (code *)0x1692db;
  test_ecmult_accumulate(acc,psVar12,scratch);
  auStack_c48._32_4_ = 1;
  auStack_c48._36_4_ = 0;
  aiStack_c20[0] = 0;
  aiStack_c20[1] = 0;
  aiStack_c20[2] = 0;
  aiStack_c20[3] = 0;
  aiStack_c20[4] = 0;
  aiStack_c20[5] = 0;
  apcStack_c70[0] = (code *)0x1692fd;
  test_ecmult_accumulate(acc,psVar12,scratch);
  apcStack_c70[0] = (code *)0x169308;
  secp256k1_scalar_negate(psVar12,psVar12);
  apcStack_c70[0] = (code *)0x169319;
  test_ecmult_accumulate(acc,psVar12,scratch);
  psVar13 = psStack_c58;
  if (psStack_c58 != (secp256k1_gej *)0x0) {
    psVar9 = (secp256k1_gej *)0x0;
    acc = &sStack_c08;
    out32 = auStack_c48;
    do {
      uStack_c5a = SUB82(psVar9,0);
      sStack_c08.s[0] = 0x6a09e667;
      sStack_c08.s[1] = 0xbb67ae85;
      sStack_c08.s[2] = 0x3c6ef372;
      sStack_c08.s[3] = 0xa54ff53a;
      sStack_c08.s[4] = 0x510e527f;
      sStack_c08.s[5] = 0x9b05688c;
      sStack_c08.s[6] = 0x1f83d9ab;
      sStack_c08.s[7] = 0x5be0cd19;
      sStack_c08.bytes = 0;
      apcStack_c70[0] = (code *)0x169375;
      secp256k1_sha256_write(acc,(uchar *)&iStack_c5e,6);
      apcStack_c70[0] = (code *)0x169380;
      secp256k1_sha256_finalize(acc,out32);
      apcStack_c70[0] = (code *)0x16938d;
      secp256k1_scalar_set_b32((secp256k1_scalar *)(auStack_c48 + 0x20),out32,(int *)0x0);
      apcStack_c70[0] = (code *)0x1693a0;
      test_ecmult_accumulate(&sStack_b98,(secp256k1_scalar *)(auStack_c48 + 0x20),scratch);
      psVar9 = (secp256k1_gej *)((long)(psVar9->x).n + 1);
    } while (psVar13 != psVar9);
  }
  hash = &sStack_b98;
  psVar6 = (secp256k1_strauss_point_state *)auStack_c48;
  apcStack_c70[0] = (code *)0x1693ba;
  secp256k1_sha256_finalize(hash,(uchar *)psVar6);
  lVar4 = 0;
  while (auStack_c48[lVar4] == *(char *)(lStack_c50 + lVar4)) {
    lVar4 = lVar4 + 1;
    if (lVar4 == 0x20) {
      apcStack_c70[0] = (code *)0x1693e7;
      secp256k1_scratch_destroy(&CTX->error_callback,scratch);
      return;
    }
  }
  apcStack_c70[0] = test_ecmult_accumulate;
  test_ecmult_constants_sha_cold_1();
  psStack_c78 = psVar13;
  auStack_1810 = (undefined1  [8])0x41;
  sStack_fe0.infinity = 0;
  sStack_fe0.x.n[0] = 0x2815b16f81798;
  sStack_fe0.x.n[1] = 0xdb2dce28d959f;
  sStack_fe0.x.n[2] = 0xe870b07029bfc;
  sStack_fe0.x.n[3] = 0xbbac55a06295c;
  sStack_fe0.x.n[4] = 0x79be667ef9dc;
  sStack_fe0.y.n[4] = 0x483ada7726a3;
  sStack_fe0.y.n[0] = 0x7d08ffb10d4b8;
  sStack_fe0.y.n[1] = 0x48a68554199c4;
  sStack_fe0.y.n[2] = 0xe1108a8fd17b4;
  sStack_fe0.y.n[3] = 0xc4655da4fbfc0;
  sStack_fe0.z.n[0] = 1;
  sStack_fe0.z.n[1] = 0;
  sStack_fe0.z.n[2] = 0;
  sStack_fe0.z.n[3] = 0;
  sStack_fe0.z.n[4] = 0;
  sStack_1060.infinity = 1;
  sStack_1060.z.n[4] = 0;
  sStack_1060.z.n[2] = 0;
  sStack_1060.z.n[3] = 0;
  sStack_1060.z.n[0] = 0;
  sStack_1060.z.n[1] = 0;
  sStack_1060.y.n[3] = 0;
  sStack_1060.y.n[4] = 0;
  sStack_1060.y.n[1] = 0;
  sStack_1060.y.n[2] = 0;
  sStack_1060.x.n[4] = 0;
  sStack_1060.y.n[0] = 0;
  sStack_1060.x.n[2] = 0;
  sStack_1060.x.n[3] = 0;
  sStack_1060.x.n[0] = 0;
  sStack_1060.x.n[1] = 0;
  psStack_1838 = (secp256k1_strauss_point_state *)0x1694ef;
  auStack_f60._712_8_ = scratch;
  psStack_c90 = acc;
  puStack_c88 = auStack_c48 + 0x20;
  psStack_c80 = psVar9;
  apcStack_c70[0] = (code *)out32;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_1630,(secp256k1_scalar *)psVar6);
  r_00 = (secp256k1_strauss_point_state *)auStack_f60;
  psStack_1838 = (secp256k1_strauss_point_state *)0x16953c;
  sStack_1730.x.n[0] = (uint64_t)asStack_15b0;
  sStack_1730.x.n[1] = (uint64_t)r_00;
  sStack_1730.x.n[2] = (uint64_t)&sStack_1470;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_1730,&sStack_16b0,1,&sStack_fe0,
             (secp256k1_scalar *)psVar6,&secp256k1_scalar_zero);
  psStack_1838 = (secp256k1_strauss_point_state *)0x16956f;
  sStack_17b0.x.n[0] = (uint64_t)asStack_15b0;
  sStack_17b0.x.n[1] = (uint64_t)r_00;
  sStack_17b0.x.n[2] = (uint64_t)&sStack_1470;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_17b0,&sStack_1730,1,&sStack_1060,
             &secp256k1_scalar_zero,(secp256k1_scalar *)psVar6);
  error_callback = (secp256k1_callback *)0xb8;
  elem = (secp256k1_strauss_point_state *)&CTX->error_callback;
  cb = (secp256k1_ecmult_multi_callback *)0x0;
  cbdata = (secp256k1_strauss_point_state *)0x0;
  psStack_1838 = (secp256k1_strauss_point_state *)0x16959e;
  psVar12 = (secp256k1_scalar *)psVar6;
  scratch_01 = scratch_00;
  iVar2 = secp256k1_ecmult_multi_var
                    ((secp256k1_callback *)elem,(secp256k1_scratch *)scratch_00,
                     (secp256k1_gej *)auStack_f60,(secp256k1_scalar *)psVar6,
                     (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  if (iVar2 == 0) {
    psStack_1838 = (secp256k1_strauss_point_state *)0x16977d;
    test_ecmult_accumulate_cold_8();
LAB_0016977d:
    psStack_1838 = (secp256k1_strauss_point_state *)0x169782;
    test_ecmult_accumulate_cold_7();
LAB_00169782:
    psStack_1838 = (secp256k1_strauss_point_state *)0x169787;
    test_ecmult_accumulate_cold_6();
LAB_00169787:
    psStack_1838 = (secp256k1_strauss_point_state *)0x16978c;
    test_ecmult_accumulate_cold_5();
LAB_0016978c:
    psStack_1838 = (secp256k1_strauss_point_state *)0x169791;
    test_ecmult_accumulate_cold_4();
LAB_00169791:
    psStack_1838 = (secp256k1_strauss_point_state *)0x169796;
    test_ecmult_accumulate_cold_3();
LAB_00169796:
    psStack_1838 = (secp256k1_strauss_point_state *)0x16979b;
    test_ecmult_accumulate_cold_2();
  }
  else {
    error_callback = &CTX->error_callback;
    psVar12 = &secp256k1_scalar_zero;
    cb = test_ecmult_accumulate_cb;
    psStack_1838 = (secp256k1_strauss_point_state *)0x1695d9;
    scratch_01 = scratch_00;
    elem = (secp256k1_strauss_point_state *)error_callback;
    cbdata = psVar6;
    iVar2 = secp256k1_ecmult_multi_var
                      (error_callback,(secp256k1_scratch *)scratch_00,asStack_15b0,
                       &secp256k1_scalar_zero,test_ecmult_accumulate_cb,psVar6,1);
    if (iVar2 == 0) goto LAB_0016977d;
    psStack_1838 = (secp256k1_strauss_point_state *)0x1695f8;
    secp256k1_ecmult_const(&sStack_17b0,&secp256k1_ge_const_g,(secp256k1_scalar *)psVar6);
    psVar6 = (secp256k1_strauss_point_state *)auStack_1808;
    psStack_1838 = (secp256k1_strauss_point_state *)0x16960d;
    secp256k1_ge_set_gej_var((secp256k1_ge *)psVar6,&sStack_1630);
    r_00 = &sStack_1470;
    psStack_1838 = (secp256k1_strauss_point_state *)0x169625;
    secp256k1_gej_neg((secp256k1_gej *)r_00,&sStack_16b0);
    psVar12 = (secp256k1_scalar *)0x0;
    psStack_1838 = (secp256k1_strauss_point_state *)0x169635;
    scratch_01 = r_00;
    elem = r_00;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)r_00,(secp256k1_gej *)r_00,(secp256k1_ge *)psVar6,
               (secp256k1_fe *)0x0);
    if (sStack_1470.wnaf_na_1[0x1e] == 0) goto LAB_00169782;
    psVar6 = &sStack_1470;
    psStack_1838 = (secp256k1_strauss_point_state *)0x169658;
    secp256k1_gej_neg((secp256k1_gej *)psVar6,&sStack_1730);
    psVar12 = (secp256k1_scalar *)0x0;
    psStack_1838 = (secp256k1_strauss_point_state *)0x16966a;
    scratch_01 = psVar6;
    elem = psVar6;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)psVar6,(secp256k1_gej *)psVar6,(secp256k1_ge *)auStack_1808,
               (secp256k1_fe *)0x0);
    if (sStack_1470.wnaf_na_1[0x1e] == 0) goto LAB_00169787;
    psVar6 = &sStack_1470;
    psStack_1838 = (secp256k1_strauss_point_state *)0x16968d;
    secp256k1_gej_neg((secp256k1_gej *)psVar6,(secp256k1_gej *)auStack_f60);
    psVar12 = (secp256k1_scalar *)0x0;
    psStack_1838 = (secp256k1_strauss_point_state *)0x16969f;
    scratch_01 = psVar6;
    elem = psVar6;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)psVar6,(secp256k1_gej *)psVar6,(secp256k1_ge *)auStack_1808,
               (secp256k1_fe *)0x0);
    if (sStack_1470.wnaf_na_1[0x1e] == 0) goto LAB_0016978c;
    psVar6 = &sStack_1470;
    psStack_1838 = (secp256k1_strauss_point_state *)0x1696c2;
    secp256k1_gej_neg((secp256k1_gej *)psVar6,asStack_15b0);
    psVar12 = (secp256k1_scalar *)0x0;
    psStack_1838 = (secp256k1_strauss_point_state *)0x1696d4;
    scratch_01 = psVar6;
    elem = psVar6;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)psVar6,(secp256k1_gej *)psVar6,(secp256k1_ge *)auStack_1808,
               (secp256k1_fe *)0x0);
    if (sStack_1470.wnaf_na_1[0x1e] == 0) goto LAB_00169791;
    psVar6 = &sStack_1470;
    psStack_1838 = (secp256k1_strauss_point_state *)0x1696f7;
    secp256k1_gej_neg((secp256k1_gej *)psVar6,&sStack_17b0);
    psVar12 = (secp256k1_scalar *)0x0;
    psStack_1838 = (secp256k1_strauss_point_state *)0x169709;
    scratch_01 = psVar6;
    elem = psVar6;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)psVar6,(secp256k1_gej *)psVar6,(secp256k1_ge *)auStack_1808,
               (secp256k1_fe *)0x0);
    if (sStack_1470.wnaf_na_1[0x1e] == 0) goto LAB_00169796;
    if (auStack_1808._80_4_ != 0) {
      sStack_1470.wnaf_na_1[0]._0_1_ = 0;
      sVar7 = 1;
LAB_0016975c:
      psStack_1838 = (secp256k1_strauss_point_state *)0x169766;
      secp256k1_sha256_write(hash,(uchar *)&sStack_1470,sVar7);
      return;
    }
    elem = (secp256k1_strauss_point_state *)auStack_1808;
    scratch_01 = &sStack_1470;
    psVar6 = (secp256k1_strauss_point_state *)auStack_1810;
    psVar12 = (secp256k1_scalar *)0x0;
    psStack_1838 = (secp256k1_strauss_point_state *)0x169749;
    secp256k1_eckey_pubkey_serialize((secp256k1_ge *)elem,(uchar *)scratch_01,(size_t *)psVar6,0);
    if (auStack_1810 == (undefined1  [8])0x41) {
      sVar7 = 0x41;
      goto LAB_0016975c;
    }
  }
  psStack_1838 = (secp256k1_strauss_point_state *)secp256k1_ecmult_multi_var;
  test_ecmult_accumulate_cold_1();
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  (r->x).n[4] = 0;
  (r->y).n[0] = 0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  if ((secp256k1_strauss_point_state *)psVar12 != (secp256k1_strauss_point_state *)0x0 ||
      sStack_1828 != 0) {
    psStack_1858 = error_callback;
    psStack_1850 = &sStack_1060;
    psStack_1848 = psVar6;
    psStack_1840 = r_00;
    psStack_1838 = &sStack_1470;
    if (sStack_1828 == 0) {
      sStack_2090.aux = asStack_2078;
      sStack_2090.pre_a = asStack_1b28;
      sStack_2090.ps = &sStack_1f38;
      secp256k1_ecmult_strauss_wnaf(&sStack_2090,r,1,r,&secp256k1_scalar_zero,psVar12);
    }
    else {
      if ((scratch_01 == (secp256k1_strauss_point_state *)0x0) ||
         (sVar7 = secp256k1_pippenger_max_points
                            ((secp256k1_callback *)elem,(secp256k1_scratch *)scratch_01), sVar7 == 0
         )) {
LAB_001699f5:
        secp256k1_ecmult_multi_simple_var(r,psVar12,cb,cbdata,sStack_1828);
        return;
      }
      uVar3 = 5000000;
      if (sVar7 < 5000000) {
        uVar3 = sVar7;
      }
      uVar11 = sStack_1828 - 1;
      uStack_2098 = uVar11 / uVar3 + 1;
      uVar3 = uVar11 / uStack_2098;
      if (uVar3 < 0x57) {
        lVar4 = 0;
        do {
          if (*(char *)((long)((secp256k1_fe *)scratch_01->wnaf_na_1)->n + lVar4) !=
              "scratch"[lVar4]) {
            (*(code *)((secp256k1_fe *)elem->wnaf_na_1)->n[0])
                      ("invalid scratch space",((secp256k1_fe *)elem->wnaf_na_1)->n[1]);
            goto LAB_001699f5;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 != 8);
        uVar8 = ((secp256k1_fe *)scratch_01->wnaf_na_1)->n[3] -
                ((secp256k1_fe *)scratch_01->wnaf_na_1)->n[2];
        uVar3 = 0;
        if (0x4a < uVar8) {
          uVar3 = uVar8 - 0x4b;
        }
        if (uVar3 < 0x8b0) goto LAB_001699f5;
        uVar3 = uVar3 / 0x8b0;
        if (4999999 < uVar3) {
          uVar3 = 5000000;
        }
        uStack_2098 = uVar11 / uVar3 + 1;
        uVar3 = uVar11 / uStack_2098;
        pcVar5 = secp256k1_ecmult_strauss_batch;
      }
      else {
        pcVar5 = secp256k1_ecmult_pippenger_batch;
      }
      uVar3 = uVar3 + 1;
      lVar4 = 0;
      uVar11 = 0;
      do {
        uVar8 = uVar3;
        if (sStack_1828 < uVar3) {
          uVar8 = sStack_1828;
        }
        psVar6 = (secp256k1_strauss_point_state *)0x0;
        if (uVar11 == 0) {
          psVar6 = (secp256k1_strauss_point_state *)psVar12;
        }
        iVar2 = (*pcVar5)(elem,scratch_01,&sStack_1f38,psVar6,cb,cbdata,uVar8,lVar4);
        if (iVar2 == 0) {
          return;
        }
        secp256k1_gej_add_var(r,r,(secp256k1_gej *)&sStack_1f38,(secp256k1_fe *)0x0);
        sStack_1828 = sStack_1828 - uVar8;
        uVar11 = uVar11 + 1;
        lVar4 = lVar4 + uVar3;
      } while (uStack_2098 != uVar11);
    }
  }
  return;
}

Assistant:

static void test_fixed_wnaf_small_helper(int *wnaf, int *wnaf_expected, int w) {
    int i;
    for (i = WNAF_SIZE(w)-1; i >= 8; --i) {
        CHECK(wnaf[i] == 0);
    }
    for (i = 7; i >= 0; --i) {
        CHECK(wnaf[i] == wnaf_expected[i]);
    }
}